

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O2

ConsCell * find_cdrpair_in_page(conspage *pg,LispPTR carpart,LispPTR cdrpart)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ConsCell *pCVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar5 = *(uint *)&pg->field_0x8;
  if (uVar5 < 0x2000000) {
    return (ConsCell *)0x0;
  }
  uVar10 = 0;
  uVar1 = uVar5 >> 0x10 & 0xff;
  uVar8 = 0;
  while( true ) {
    uVar6 = uVar1;
    if (uVar6 == 0) {
      return (ConsCell *)0x0;
    }
    if (uVar8 <= uVar6 + 0xe && uVar6 < uVar8) {
      uVar2 = 0;
      uVar1 = uVar6;
      goto LAB_00110816;
    }
    uVar9 = (ulong)uVar6;
    if (uVar6 <= uVar8 + 0xe && (uVar8 < uVar6 && uVar8 != 0)) break;
    uVar10 = (ulong)uVar8;
    uVar1 = (uint)*(byte *)((long)&pg->cell6 + uVar9 * 2 + 3);
    uVar8 = uVar6;
  }
  uVar3 = (ulong)uVar8;
  uVar1 = *(uint *)((long)&pg->cell6 + uVar9 * 2);
  if ((int)uVar10 == 0) {
    uVar5 = uVar5 & 0xff00ffff | uVar1 >> 8 & 0xff0000;
  }
  else {
    *(char *)((long)&pg->cell6 + uVar10 * 2 + 3) = (char)(uVar1 >> 0x18);
    uVar5 = *(uint *)&pg->field_0x8;
  }
  pCVar4 = (ConsCell *)((long)&pg->cell6 + uVar3 * 2);
  *(uint *)&pg->field_0x8 = uVar5 + 0xfe000000;
  goto LAB_001108da;
  while (uVar6 = uVar8, uVar2 = uVar1, uVar1 = uVar12, uVar12 < uVar8) {
LAB_00110816:
    uVar11 = uVar2;
    uVar7 = uVar6;
    uVar3 = (ulong)uVar1;
    uVar12 = *(uint *)((long)&pg->cell6 + uVar3 * 2) >> 0x18;
    if (uVar12 <= uVar1) break;
  }
  uVar9 = (ulong)uVar8;
  uVar1 = *(uint *)((long)&pg->cell6 + (ulong)uVar7 * 2);
  if ((int)uVar10 == 0) {
    *(uint *)&pg->field_0x8 = uVar5 & 0xff00ffff | uVar1 >> 8 & 0xff0000;
  }
  else {
    *(char *)((long)&pg->cell6 + uVar10 * 2 + 3) = (char)(uVar1 >> 0x18);
  }
  pCVar4 = (ConsCell *)((long)&pg->cell6 + uVar3 * 2);
  if (uVar11 != 0) {
    *(undefined1 *)((long)&pg->cell6 + (ulong)uVar11 * 2 + 3) = pCVar4->field_0x3;
  }
  pg->field_0xb = (char)((uint)(byte)pg->field_0xb * 0x1000000 + -0x2000000 >> 0x18);
LAB_001108da:
  *(LispPTR *)((long)&pg->cell6 + uVar3 * 2) = carpart;
  *(LispPTR *)((long)&pg->cell6 + uVar9 * 2) = cdrpart;
  *pCVar4 = (ConsCell)
            ((uint)*pCVar4 & 0xfffffff | ((int)(uVar9 * 2) - (int)(uVar3 * 2) & 0xfffffffcU) << 0x1a
            );
  return pCVar4;
}

Assistant:

static ConsCell *find_cdrpair_in_page(struct conspage *pg, LispPTR carpart, LispPTR cdrpart) {
  unsigned offset, prior, priorprior, nprior, poffset, noffset;

  prior = priorprior = nprior = 0;

  if (pg->count < 2) return (ConsCell *)0;

  offset = pg->next_cell;

  while (offset) {
    if (prior && (offset < prior) && (prior <= offset + 14)) {
      ConsCell *carcell, *cdrcell;

      poffset = offset;
      noffset = FREECONS(pg, offset)->next_free;
      while ((noffset > offset) && (noffset < prior)) {
        nprior = offset;
        poffset = prior;
        offset = noffset;
        noffset = FREECONS(pg, offset)->next_free;
      }

      carcell = (ConsCell *)(((DLword *)pg) + offset);
      cdrcell = (ConsCell *)(((DLword *)pg) + prior);
      if (priorprior)
        FREECONS(pg, priorprior)->next_free = FREECONS(pg, poffset)->next_free;
      else
        pg->next_cell = FREECONS(pg, poffset)->next_free;

      if (nprior) FREECONS(pg, nprior)->next_free = FREECONS(pg, offset)->next_free;

      pg->count -= 2;

      *(LispPTR *)carcell = carpart;
      *(LispPTR *)cdrcell = cdrpart;

      carcell->cdr_code = (cdrcell - carcell);
      return (carcell);
    } else if (prior && (offset > prior) && (offset <= prior + 14)) {
      ConsCell *carcell, *cdrcell;

      carcell = (ConsCell *)(((DLword *)pg) + prior);
      cdrcell = (ConsCell *)(((DLword *)pg) + offset);
      if (priorprior)
        FREECONS(pg, priorprior)->next_free = ((freecons *)cdrcell)->next_free;
      else
        pg->next_cell = ((freecons *)cdrcell)->next_free;

      pg->count -= 2;

      *(LispPTR *)carcell = carpart;
      *(LispPTR *)cdrcell = cdrpart;

      carcell->cdr_code = (cdrcell - carcell);
      return (carcell);
    }
    priorprior = prior;
    prior = offset;
    offset = FREECONS(pg, offset)->next_free;
  }

  return (0); /* found no entries in this page, so return failure code */
}